

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

bool __thiscall cmdline::parser::parse(parser *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  size_type sVar5;
  mapped_type *ppoVar6;
  size_type sVar7;
  pointer ppVar8;
  size_type sVar9;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  iterator p_2;
  int j;
  bool jump_next;
  char last;
  string name_1;
  string val;
  string name;
  char *p_1;
  int i;
  char initial;
  iterator p;
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lookup;
  value_type *in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa40;
  int in_stack_fffffffffffffa44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa48;
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa50;
  allocator<char> *in_stack_fffffffffffffa58;
  mapped_type *in_stack_fffffffffffffa60;
  allocator<char> *in_stack_fffffffffffffa70;
  mapped_type *in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa87;
  mapped_type *in_stack_fffffffffffffa88;
  string *in_stack_fffffffffffffaa8;
  undefined7 in_stack_fffffffffffffab0;
  undefined1 in_stack_fffffffffffffab7;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  mapped_type *in_stack_fffffffffffffaf8;
  parser *in_stack_fffffffffffffb00;
  _Self local_3a8;
  _Self local_3a0;
  allocator<char> local_391 [40];
  allocator<char> local_369 [40];
  string local_341 [2];
  allocator<char> local_2f9 [72];
  allocator<char> local_2b1 [72];
  allocator<char> local_269 [72];
  allocator<char> local_221 [33];
  int local_200;
  byte local_1fb;
  undefined1 local_1fa;
  allocator<char> local_1f9 [104];
  allocator<char> local_191 [40];
  allocator<char> local_169 [40];
  allocator<char> local_141 [33];
  char *local_120;
  int local_114;
  _Base_ptr local_110;
  undefined4 local_108;
  allocator<char> local_101 [104];
  char local_99;
  _Self local_98;
  _Self local_90 [9];
  allocator<char> local_41 [33];
  long local_20;
  int local_14;
  bool local_1;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1abcfa);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1abd0e);
  if (local_14 < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                in_stack_fffffffffffffa38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
    std::allocator<char>::~allocator(local_41);
    local_1 = false;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (char *)in_stack_fffffffffffffa38);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (char *)in_stack_fffffffffffffa38);
    }
    std::
    map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x1abe33);
    local_90[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)in_stack_fffffffffffffa38);
    while( true ) {
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)in_stack_fffffffffffffa38);
      bVar1 = std::operator==(local_90,&local_98);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                             *)0x1abe8a);
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length(&ppVar8->first);
      if (sVar4 != 0) {
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                               *)0x1abeaa);
        iVar2 = (*ppVar8->second->_vptr_option_base[9])();
        local_99 = (char)iVar2;
        if (local_99 != '\0') {
          sVar7 = std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::count(in_stack_fffffffffffffa50,(key_type *)in_stack_fffffffffffffa48);
          if (sVar7 != 0) {
            std::
            map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                         (key_type *)in_stack_fffffffffffffa78);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                      (char *)in_stack_fffffffffffffa38);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                       (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
            std::operator+(in_stack_fffffffffffffa48,(char)((uint)in_stack_fffffffffffffa44 >> 0x18)
                          );
            std::operator+(in_stack_fffffffffffffa48,
                           (char *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                        in_stack_fffffffffffffa38);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
            std::allocator<char>::~allocator(local_101);
            local_1 = false;
            goto LAB_001ad3ba;
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                        *)0x1ac0e0);
          std::
          map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                       (key_type *)in_stack_fffffffffffffa78);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                     in_stack_fffffffffffffa38);
        }
      }
      local_110 = (_Base_ptr)
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                  ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                                *)in_stack_fffffffffffffa48,in_stack_fffffffffffffa44);
    }
    for (local_114 = 1; local_114 < local_14; local_114 = local_114 + 1) {
      iVar2 = strncmp(*(char **)(local_20 + (long)local_114 * 8),"--",2);
      if (iVar2 == 0) {
        local_120 = strchr((char *)(*(long *)(local_20 + (long)local_114 * 8) + 2),0x3d);
        if (local_120 == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                     (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
          std::allocator<char>::~allocator(local_191);
          sVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                           *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
          if (sVar5 == 0) {
            std::operator+((char *)in_stack_fffffffffffffa88,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                        in_stack_fffffffffffffa38);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
            local_108 = 7;
          }
          else {
            ppoVar6 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                                   in_stack_fffffffffffffa78);
            uVar3 = (*(*ppoVar6)->_vptr_option_base[2])();
            if ((uVar3 & 1) == 0) {
              set_option((parser *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
                         in_stack_fffffffffffffaa8);
            }
            else {
              if (local_14 <= local_114 + 1) {
                std::operator+((char *)in_stack_fffffffffffffa88,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            in_stack_fffffffffffffa38);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
                local_108 = 7;
                goto LAB_001ac6a4;
              }
              local_114 = local_114 + 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                         (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
              set_option(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                         (string *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
              std::allocator<char>::~allocator(local_1f9);
            }
            local_108 = 0;
          }
LAB_001ac6a4:
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    (in_stack_fffffffffffffa60,(char *)in_stack_fffffffffffffa58,
                     (char *)in_stack_fffffffffffffa50,(allocator<char> *)in_stack_fffffffffffffa48)
          ;
          std::allocator<char>::~allocator(local_141);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                     (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
          std::allocator<char>::~allocator(local_169);
          set_option(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                     (string *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
        }
      }
      else {
        iVar2 = strncmp(*(char **)(local_20 + (long)local_114 * 8),"-",1);
        if (iVar2 == 0) {
          if (*(char *)(*(long *)(local_20 + (long)local_114 * 8) + 1) != '\0') {
            local_1fa = *(undefined1 *)(*(long *)(local_20 + (long)local_114 * 8) + 1);
            local_1fb = 0;
            for (local_200 = 2;
                *(char *)(*(long *)(local_20 + (long)local_114 * 8) + (long)local_200) != '\0';
                local_200 = local_200 + 1) {
              if (('/' < *(char *)(*(long *)(local_20 + (long)local_114 * 8) + (long)local_200)) &&
                 (*(char *)(*(long *)(local_20 + (long)local_114 * 8) + (long)local_200) < ':')) {
                std::
                map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                             (key_type *)in_stack_fffffffffffffa78);
                ppoVar6 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                                        *)CONCAT17(in_stack_fffffffffffffa87,
                                                   in_stack_fffffffffffffa80),
                                       in_stack_fffffffffffffa78);
                uVar3 = (*(*ppoVar6)->_vptr_option_base[2])();
                if ((uVar3 & 1) != 0) {
                  std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                               (key_type *)in_stack_fffffffffffffa78);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                             (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
                  set_option(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                             (string *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0)
                            );
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
                  std::allocator<char>::~allocator(local_221);
                  local_1fb = 1;
                  break;
                }
              }
              local_1fa = *(undefined1 *)
                           (*(long *)(local_20 + (long)local_114 * 8) + (long)local_200);
              sVar7 = std::
                      map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::count(in_stack_fffffffffffffa50,(key_type *)in_stack_fffffffffffffa48);
              if (sVar7 == 0) {
                in_stack_fffffffffffffb00 = (parser *)(in_RDI + 0xa0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                           (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
                std::operator+(in_stack_fffffffffffffa48,
                               (char)((uint)in_stack_fffffffffffffa44 >> 0x18));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            in_stack_fffffffffffffa38);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
                std::allocator<char>::~allocator(local_269);
              }
              else {
                in_stack_fffffffffffffaf8 =
                     std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                                  (key_type *)in_stack_fffffffffffffa78);
                in_stack_fffffffffffffaf7 =
                     std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40
                                                ),(char *)in_stack_fffffffffffffa38);
                if ((bool)in_stack_fffffffffffffaf7) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                             (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
                  std::operator+(in_stack_fffffffffffffa48,
                                 (char)((uint)in_stack_fffffffffffffa44 >> 0x18));
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                              in_stack_fffffffffffffa38);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
                  std::allocator<char>::~allocator(local_2b1);
                }
                else {
                  std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                               (key_type *)in_stack_fffffffffffffa78);
                  set_option((parser *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0)
                             ,in_stack_fffffffffffffaa8);
                }
              }
            }
            sVar7 = std::
                    map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::count(in_stack_fffffffffffffa50,(key_type *)in_stack_fffffffffffffa48);
            if (sVar7 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                         (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
              std::operator+(in_stack_fffffffffffffa48,
                             (char)((uint)in_stack_fffffffffffffa44 >> 0x18));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                          in_stack_fffffffffffffa38);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
              std::allocator<char>::~allocator(local_2f9);
            }
            else {
              std::
              map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                           (key_type *)in_stack_fffffffffffffa78);
              in_stack_fffffffffffffab7 =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                                   (char *)in_stack_fffffffffffffa38);
              if ((bool)in_stack_fffffffffffffab7) {
                in_stack_fffffffffffffaa8 = local_341;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                           (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
                std::operator+(in_stack_fffffffffffffa48,
                               (char)((uint)in_stack_fffffffffffffa44 >> 0x18));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            in_stack_fffffffffffffa38);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
                std::allocator<char>::~allocator((allocator<char> *)local_341);
              }
              else if ((local_1fb & 1) == 0) {
                if (local_114 + 1 < local_14) {
                  std::
                  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                               (key_type *)in_stack_fffffffffffffa78);
                  in_stack_fffffffffffffa88 =
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80)
                                    ,in_stack_fffffffffffffa78);
                  uVar3 = (*(*in_stack_fffffffffffffa88)->_vptr_option_base[2])();
                  in_stack_fffffffffffffa87 = (undefined1)uVar3;
                  if ((uVar3 & 1) != 0) {
                    in_stack_fffffffffffffa78 =
                         std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)CONCAT17(in_stack_fffffffffffffa87,
                                                  in_stack_fffffffffffffa80),
                                      (key_type *)in_stack_fffffffffffffa78);
                    in_stack_fffffffffffffa70 = local_369;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                               (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
                    set_option(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
                    std::allocator<char>::~allocator(local_369);
                    local_114 = local_114 + 1;
                    goto LAB_001ad21b;
                  }
                }
                in_stack_fffffffffffffa60 =
                     std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                                  (key_type *)in_stack_fffffffffffffa78);
                set_option((parser *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
                           in_stack_fffffffffffffaa8);
              }
            }
          }
        }
        else {
          in_stack_fffffffffffffa48 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x88);
          in_stack_fffffffffffffa50 =
               *(map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 **)(local_20 + (long)local_114 * 8);
          in_stack_fffffffffffffa58 = local_391;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                     (char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                      in_stack_fffffffffffffa38);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
          std::allocator<char>::~allocator(local_391);
        }
      }
LAB_001ad21b:
    }
    local_3a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)in_stack_fffffffffffffa38);
    while( true ) {
      local_3a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)in_stack_fffffffffffffa38);
      bVar1 = std::operator==(&local_3a0,&local_3a8);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                             *)0x1ad288);
      uVar3 = (*ppVar8->second->_vptr_option_base[6])();
      in_stack_fffffffffffffa44 = CONCAT13((char)uVar3,(int3)in_stack_fffffffffffffa44);
      if ((uVar3 & 1) == 0) {
        in_stack_fffffffffffffa38 = (value_type *)(in_RDI + 0xa0);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                      *)0x1ad2c8);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                   in_stack_fffffffffffffa78);
        std::operator+((char *)in_stack_fffffffffffffa48,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                    in_stack_fffffffffffffa38);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                    *)in_stack_fffffffffffffa48,in_stack_fffffffffffffa44);
    }
    sVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0xa0));
    local_1 = sVar9 == 0;
LAB_001ad3ba:
    local_108 = 1;
    std::
    map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1ad3c7);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool parse(int argc, const char *const argv[]) {
    errors.clear();
    others.clear();

    if (argc < 1) {
      errors.push_back("argument number must be longer than 0");
      return false;
    }
    if (prog_name == "")
      prog_name = argv[0];

    std::map<char, std::string> lookup;
    for (std::map<std::string, option_base *>::iterator p = options.begin();
         p != options.end(); p++) {
      if (p->first.length() == 0)
        continue;
      char initial = p->second->short_name();
      if (initial) {
        if (lookup.count(initial) > 0) {
          lookup[initial] = "";
          errors.push_back(std::string("short option '") + initial +
                           "' is ambiguous");
          return false;
        }
        else
          lookup[initial] = p->first;
      }
    }

    for (int i = 1; i < argc; i++) {
      if (strncmp(argv[i], "--", 2) == 0) {
        const char *p = strchr(argv[i] + 2, '=');
        if (p) {
          std::string name(argv[i] + 2, p);
          std::string val(p + 1);
          set_option(name, val);
        }
        else {
          std::string name(argv[i] + 2);
          if (options.count(name) == 0) {
            errors.push_back("undefined option: --" + name);
            continue;
          }
          if (options[name]->has_value()) {
            if (i + 1 >= argc) {
              errors.push_back("option needs value: --" + name);
              continue;
            }
            else {
              i++;
              set_option(name, argv[i]);
            }
          }
          else {
            set_option(name);
          }
        }
      }
      else if (strncmp(argv[i], "-", 1) == 0) {
        if (!argv[i][1])
          continue;
        char last = argv[i][1];
        bool jump_next = false;
        for (int j = 2; argv[i][j]; j++) {
          if (argv[i][j] >= '0' && argv[i][j] <= '9' &&
              options[lookup[last]]->has_value()) {
            set_option(lookup[last], &argv[i][j]);
            jump_next = true;
            break;
          }
          last = argv[i][j];
          if (lookup.count(argv[i][j - 1]) == 0) {
            errors.push_back(std::string("undefined short option: -") +
                             argv[i][j - 1]);
            continue;
          }
          if (lookup[argv[i][j - 1]] == "") {
            errors.push_back(std::string("ambiguous short option: -") +
                             argv[i][j - 1]);
            continue;
          }
          set_option(lookup[argv[i][j - 1]]);
        }

        if (lookup.count(last) == 0) {
          errors.push_back(std::string("undefined short option: -") + last);
          continue;
        }
        if (lookup[last] == "") {
          errors.push_back(std::string("ambiguous short option: -") + last);
          continue;
        }
        if (jump_next) {
          continue;
        }
        if (i + 1 < argc && options[lookup[last]]->has_value()) {
          set_option(lookup[last], argv[i + 1]);
          i++;
        }
        else {
          set_option(lookup[last]);
        }
      }
      else {
        others.push_back(argv[i]);
      }
    }

    for (std::map<std::string, option_base *>::iterator p = options.begin();
         p != options.end(); p++)
      if (!p->second->valid())
        errors.push_back("need option: --" + std::string(p->first));

    return errors.size() == 0;
  }